

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rp.cpp
# Opt level: O2

uint64_t substitution_round<hf_queue<ll_el<unsigned_int,unsigned_int>,unsigned_int,unsigned_int>>
                   (hf_queue<ll_el<unsigned_int,_unsigned_int>,_unsigned_int,_unsigned_int> *Q,
                   TP_t *TP,text_t *T)

{
  itype iVar1;
  bool bVar2;
  uint uVar3;
  cpair cVar4;
  cpair cVar5;
  uint uVar6;
  itype iVar7;
  ulong uVar8;
  ulong uVar9;
  itype iVar10;
  cpair cVar11;
  triple_t tVar12;
  cpair AB;
  cpair local_70;
  hf_queue<ll_el<unsigned_int,_unsigned_int>,_unsigned_int,_unsigned_int> *local_68;
  pair_hash<triple<unsigned_int>,_unsigned_int,_unsigned_int> *local_60;
  ulong local_58;
  itype local_4c;
  TP_t *local_48;
  ulong local_40;
  ulong local_38;
  
  local_70 = hf_queue<ll_el<unsigned_int,_unsigned_int>,_unsigned_int,_unsigned_int>::max(Q);
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::push_back(&G,&local_70);
  tVar12 = hf_queue<ll_el<unsigned_int,_unsigned_int>,_unsigned_int,_unsigned_int>::operator[]
                     (Q,local_70);
  local_4c = tVar12.F_ab;
  local_40 = (ulong)(tVar12.L_ab + tVar12.P_ab);
  n_distinct_freqs = n_distinct_freqs + (local_4c != last_freq);
  local_60 = &Q->H;
  uVar8 = (ulong)tVar12.P_ab;
  last_freq = local_4c;
  local_68 = Q;
  local_58 = uVar8;
  for (; uVar9 = local_58, local_48 = TP, uVar8 < local_40; uVar8 = uVar8 + 1) {
    uVar6 = (TP->TP).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start[uVar8];
    cVar4 = skippable_text<unsigned_int,_unsigned_int>::pair_starting_at(T,uVar6);
    if ((local_70.first == cVar4.first) && (local_70.second == cVar4.second)) {
      cVar4 = skippable_text<unsigned_int,_unsigned_int>::pair_ending_at(T,uVar6);
      cVar5 = skippable_text<unsigned_int,_unsigned_int>::next_pair(T,uVar6);
      skippable_text<unsigned_int,_unsigned_int>::replace(T,uVar6,X);
      bVar2 = pair_hash<triple<unsigned_int>,_unsigned_int,_unsigned_int>::count(local_60,cVar4);
      if ((bVar2) && ((local_70.first != cVar4.first || (local_70.second != cVar4.second)))) {
        hf_queue<ll_el<unsigned_int,_unsigned_int>,_unsigned_int,_unsigned_int>::decrease
                  (local_68,cVar4);
      }
      bVar2 = pair_hash<triple<unsigned_int>,_unsigned_int,_unsigned_int>::count(local_60,cVar5);
      if ((bVar2) && ((local_70.first != cVar5.first || (local_70.second != cVar5.second)))) {
        hf_queue<ll_el<unsigned_int,_unsigned_int>,_unsigned_int,_unsigned_int>::decrease
                  (local_68,cVar5);
      }
    }
  }
  for (; uVar9 < local_40; uVar9 = uVar9 + 1) {
    uVar6 = (TP->TP).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start[uVar9];
    uVar3 = skippable_text<unsigned_int,_unsigned_int>::at(T,uVar6);
    if (uVar3 == X) {
      local_58 = uVar9;
      cVar4 = skippable_text<unsigned_int,_unsigned_int>::pair_ending_at(T,uVar6);
      cVar5 = skippable_text<unsigned_int,_unsigned_int>::pair_starting_at(T,uVar6);
      iVar1 = T->BLANK;
      uVar8 = (ulong)cVar5 >> 0x20;
      iVar10 = cVar4.first;
      uVar6 = cVar5.second;
      iVar7 = iVar10;
      if (X == iVar10) {
        iVar7 = local_70.second;
      }
      if (X == uVar6) {
        uVar8 = (ulong)local_70 & 0xffffffff;
      }
      local_38 = (ulong)local_70 & 0xffffffff;
      if (iVar1 == cVar4.second && iVar1 == iVar10) {
        iVar7 = iVar10;
        local_38 = (ulong)cVar4 >> 0x20;
      }
      bVar2 = iVar1 == cVar5.first;
      if (iVar1 == uVar6 && bVar2) {
        uVar8 = (ulong)uVar6;
      }
      uVar9 = (ulong)local_70.second;
      if (iVar1 == uVar6 && bVar2) {
        uVar9 = (ulong)cVar5 & 0xffffffff;
      }
      cVar11 = (cpair)(uVar9 + (uVar8 << 0x20));
      bVar2 = pair_hash<triple<unsigned_int>,_unsigned_int,_unsigned_int>::count(local_60,cVar11);
      if ((bVar2) && (((uint)uVar9 != local_70.first || ((uint)uVar8 != local_70.second)))) {
        synchro_or_remove_pair<hf_queue<ll_el<unsigned_int,unsigned_int>,unsigned_int,unsigned_int>>
                  (local_68,local_48,T,cVar11);
      }
      uVar8 = local_38;
      cVar11 = (cpair)((ulong)iVar7 | local_38 << 0x20);
      bVar2 = pair_hash<triple<unsigned_int>,_unsigned_int,_unsigned_int>::count(local_60,cVar11);
      TP = local_48;
      uVar9 = local_58;
      if ((bVar2) && ((iVar7 != local_70.first || ((uint)uVar8 != local_70.second)))) {
        synchro_or_remove_pair<hf_queue<ll_el<unsigned_int,unsigned_int>,unsigned_int,unsigned_int>>
                  (local_68,local_48,T,cVar11);
      }
    }
  }
  uVar8 = (ulong)local_4c;
  synchronize<hf_queue<ll_el<unsigned_int,unsigned_int>,unsigned_int,unsigned_int>>
            (local_68,TP,T,local_70);
  X = X + 1;
  return uVar8;
}

Assistant:

uint64_t substitution_round(queue_t & Q, TP_t & TP, text_t & T){

	using ctype = text_t::char_type;

	//compute max
	cpair AB = Q.max();

	G.push_back(AB);

	//cout << "MAX freq = " << Q[AB].F_ab << endl;

	assert(Q.contains(AB));
	assert(Q[AB].F_ab >= Q.minimum_frequency());

	//extract P_AB and L_AB
	auto q_el = Q[AB];
	itype F_AB = q_el.F_ab;
	itype P_AB = q_el.P_ab;
	itype L_AB = q_el.L_ab;

	uint64_t f_replaced = F_AB;

	n_distinct_freqs += (F_AB != last_freq);
	last_freq = F_AB;

	for(itype j = P_AB; j<P_AB+L_AB;++j){

		itype i = TP[j];

		if(T.pair_starting_at(i) == AB){

			ctype A = AB.first;
			ctype B = AB.second;

			//the context of AB is xABy. We now extract AB's context:
			cpair xA = T.pair_ending_at(i);
			cpair By = T.next_pair(i);

			assert(xA == T.blank_pair() or xA.second == A);
			assert(By == T.blank_pair() or By.first == B);

			//note: xA and By could be blank pairs if this AB was the first/last pair in the text

			//perform replacement
			T.replace(i,X);

			assert(By == T.blank_pair() || T.pair_starting_at(i) == cpair(X,By.second));

			if(Q.contains(xA) && xA != AB){

				Q.decrease(xA);

			}

			if(Q.contains(By) && By != AB){

				Q.decrease(By);

			}

		}

	}

	/*
	 * re-scan text positions associated to AB and synchronize if needed
	 */
	for(itype j = P_AB; j<P_AB+L_AB;++j){

		itype i = TP[j];

		assert(T.pair_starting_at(i) != AB); //we replaced all ABs ...

		if(T[i] == X){

			//the context of X is xXy. We now extract X's left (x) and right (y) contexts:
			cpair xX = T.pair_ending_at(i);
			cpair Xy = T.pair_starting_at(i);

			ctype A = AB.first;
			ctype B = AB.second;

			//careful: x and y could be = X. in this case, before the replacements this xX was equal to ABAB -> a BA disappeared
			ctype x = xX.first == X ? B : xX.first;
			ctype y = Xy.second == X ? A : Xy.second;

			//these are the pairs that disappeared
			cpair xA = xX == T.blank_pair() ? xX : cpair {x,A};
			cpair By = Xy == T.blank_pair() ? Xy : cpair {B,y};

			if(Q.contains(By) && By != AB){

				synchro_or_remove_pair<queue_t>(Q, TP, T, By);

			}

			if(Q.contains(xA) && xA != AB){

				synchro_or_remove_pair<queue_t>(Q, TP, T, xA);

			}

		}

	}

	assert(Q.contains(AB));
	synchronize<queue_t>(Q, TP, T, AB); //automatically removes AB since new AB's frequency is 0
	assert(not Q.contains(AB));

	//advance next free dictionary symbol
	X++;

	//cout << " current text size = " << T.number_of_non_blank_characters() << endl << endl;

	return f_replaced;

}